

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_operators.hpp
# Opt level: O0

type * __thiscall
Disa::cross_product<double,3ul,3ul>
          (type *__return_storage_ptr__,Disa *this,Vector_Dense<double,_3UL> *vector_0,
          Vector_Dense<double,_3UL> *vector_1)

{
  double dVar1;
  double dVar2;
  double dVar3;
  source_location *psVar4;
  source_location *location;
  ostream *poVar5;
  size_type sVar6;
  const_reference pvVar7;
  double local_1e8;
  double local_1e0;
  double local_1d8;
  initializer_list<double> local_1d0;
  double local_1c0 [3];
  initializer_list<double> local_1a8;
  string local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  undefined **local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined **local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  array<double,_3UL> *local_18;
  Vector_Dense<double,_3UL> *vector_1_local;
  Vector_Dense<double,_3UL> *vector_0_local;
  
  local_18 = &vector_0->super_array<double,_3UL>;
  vector_1_local = (Vector_Dense<double,_3UL> *)this;
  psVar4 = (source_location *)std::array<double,_3UL>::size((array<double,_3UL> *)this);
  location = (source_location *)std::array<double,_3UL>::size(local_18);
  if (psVar4 != location) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"\n");
    local_40 = &PTR_s__workspace_llm4binary_github_lic_001b54c8;
    console_format_abi_cxx11_(&local_38,(Disa *)0x0,(Log_Level)&local_40,location);
    poVar5 = std::operator<<(poVar5,(string *)&local_38);
    sVar6 = std::array<double,_3UL>::size(&vector_1_local->super_array<double,_3UL>);
    std::__cxx11::to_string(&local_f0,sVar6);
    std::operator+(&local_d0,"Incompatible vector sizes, ",&local_f0);
    std::operator+(&local_b0,&local_d0," vs. ");
    sVar6 = std::array<double,_3UL>::size(local_18);
    std::__cxx11::to_string(&local_110,sVar6);
    std::operator+(&local_90,&local_b0,&local_110);
    std::operator+(&local_70,&local_90,".");
    poVar5 = std::operator<<(poVar5,(string *)&local_70);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_38);
    exit(1);
  }
  sVar6 = std::array<double,_3UL>::size(&vector_1_local->super_array<double,_3UL>);
  if (sVar6 != 2) {
    sVar6 = std::array<double,_3UL>::size(&vector_1_local->super_array<double,_3UL>);
    if (sVar6 != 3) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"\n");
      local_138 = &PTR_s__workspace_llm4binary_github_lic_001b54e0;
      console_format_abi_cxx11_(&local_130,(Disa *)0x0,(Log_Level)&local_138,location);
      poVar5 = std::operator<<(poVar5,(string *)&local_130);
      sVar6 = std::array<double,_3UL>::size(&vector_1_local->super_array<double,_3UL>);
      std::__cxx11::to_string(&local_198,sVar6);
      std::operator+(&local_178,"Incompatible vector size, ",&local_198);
      std::operator+(&local_158,&local_178,", must be 2 or 3.");
      poVar5 = std::operator<<(poVar5,(string *)&local_158);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_130);
      exit(1);
    }
  }
  sVar6 = std::array<double,_3UL>::size(&vector_1_local->super_array<double,_3UL>);
  if (sVar6 == 2) {
    local_1c0[0] = 0.0;
    local_1c0[1] = 0.0;
    pvVar7 = std::array<double,_3UL>::operator[](&vector_1_local->super_array<double,_3UL>,0);
    dVar1 = *pvVar7;
    pvVar7 = std::array<double,_3UL>::operator[](local_18,1);
    dVar2 = *pvVar7;
    pvVar7 = std::array<double,_3UL>::operator[](&vector_1_local->super_array<double,_3UL>,1);
    dVar3 = *pvVar7;
    pvVar7 = std::array<double,_3UL>::operator[](local_18,0);
    local_1c0[2] = dVar1 * dVar2 + -(dVar3 * *pvVar7);
    local_1a8._M_array = local_1c0;
    local_1a8._M_len = 3;
    Vector_Dense<double,_3UL>::Vector_Dense(__return_storage_ptr__,&local_1a8);
  }
  else {
    pvVar7 = std::array<double,_3UL>::operator[](&vector_1_local->super_array<double,_3UL>,1);
    dVar1 = *pvVar7;
    pvVar7 = std::array<double,_3UL>::operator[](local_18,2);
    dVar2 = *pvVar7;
    pvVar7 = std::array<double,_3UL>::operator[](&vector_1_local->super_array<double,_3UL>,2);
    dVar3 = *pvVar7;
    pvVar7 = std::array<double,_3UL>::operator[](local_18,1);
    local_1e8 = dVar1 * dVar2 + -(dVar3 * *pvVar7);
    pvVar7 = std::array<double,_3UL>::operator[](&vector_1_local->super_array<double,_3UL>,2);
    dVar1 = *pvVar7;
    pvVar7 = std::array<double,_3UL>::operator[](local_18,0);
    dVar2 = *pvVar7;
    pvVar7 = std::array<double,_3UL>::operator[](&vector_1_local->super_array<double,_3UL>,0);
    dVar3 = *pvVar7;
    pvVar7 = std::array<double,_3UL>::operator[](local_18,2);
    local_1e0 = dVar1 * dVar2 + -(dVar3 * *pvVar7);
    pvVar7 = std::array<double,_3UL>::operator[](&vector_1_local->super_array<double,_3UL>,0);
    dVar1 = *pvVar7;
    pvVar7 = std::array<double,_3UL>::operator[](local_18,1);
    dVar2 = *pvVar7;
    pvVar7 = std::array<double,_3UL>::operator[](&vector_1_local->super_array<double,_3UL>,1);
    dVar3 = *pvVar7;
    pvVar7 = std::array<double,_3UL>::operator[](local_18,0);
    local_1d8 = dVar1 * dVar2 + -(dVar3 * *pvVar7);
    local_1d0._M_array = &local_1e8;
    local_1d0._M_len = 3;
    Vector_Dense<double,_3UL>::Vector_Dense(__return_storage_ptr__,&local_1d0);
  }
  return __return_storage_ptr__;
}

Assistant:

constexpr typename Static_Promoter<Vector_Dense<_type, _size_0>, Vector_Dense<_type, _size_1>>::type cross_product(
const Vector_Dense<_type, _size_0>& vector_0, const Vector_Dense<_type, _size_1>& vector_1) {
  ASSERT_DEBUG(vector_0.size() == vector_1.size(), "Incompatible vector sizes, " + std::to_string(vector_0.size()) +
                                                   " vs. " + std::to_string(vector_1.size()) + ".");
  ASSERT_DEBUG(vector_0.size() == 2 || vector_0.size() == 3,
               "Incompatible vector size, " + std::to_string(vector_0.size()) + ", must be 2 or 3.");
  typedef typename Static_Promoter<Vector_Dense<_type, _size_0>, Vector_Dense<_type, _size_1>>::type _return_vector;
  if(vector_0.size() == 2) return {0.0, 0.0, vector_0[0] * vector_1[1] - vector_0[1] * vector_1[0]};
  else
    return {vector_0[1] * vector_1[2] - vector_0[2] * vector_1[1],
            vector_0[2] * vector_1[0] - vector_0[0] * vector_1[2],
            vector_0[0] * vector_1[1] - vector_0[1] * vector_1[0]};
}